

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteVFormatRaw(xmlTextWriterPtr writer,char *format,__va_list_tag *argptr)

{
  int iVar1;
  xmlChar *str;
  
  if ((writer != (xmlTextWriterPtr)0x0) &&
     (str = xmlTextWriterVSprintf(format,argptr), str != (xmlChar *)0x0)) {
    iVar1 = xmlStrlen(str);
    iVar1 = xmlTextWriterWriteRawLen(writer,str,iVar1);
    (*xmlFree)(str);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteVFormatRaw(xmlTextWriterPtr writer, const char *format,
                             va_list argptr)
{
    int rc;
    xmlChar *buf;

    if (writer == NULL)
        return -1;

    buf = xmlTextWriterVSprintf(format, argptr);
    if (buf == NULL)
        return -1;

    rc = xmlTextWriterWriteRaw(writer, buf);

    xmlFree(buf);
    return rc;
}